

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_HitWater(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  int iVar2;
  sector_t *sec;
  char *pcVar3;
  AActor *thing;
  bool alert;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00433226;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00433216:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00433226:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181a,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  thing = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (thing == (AActor *)0x0) goto LAB_004330a8;
    bVar1 = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00433226;
    }
  }
  else {
    if (thing != (AActor *)0x0) goto LAB_00433216;
LAB_004330a8:
    thing = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
LAB_0043324e:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181b,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x03') {
    pcVar3 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_0043324e;
  }
  sec = (sector_t *)param[1].field_0.field_1.a;
  if (sec == (sector_t *)0x0) {
    NullParam("\"sec\"");
    sec = (sector_t *)param[1].field_0.field_1.a;
  }
  if ((uint)numparam < 3) {
    pcVar3 = "(paramnum) < numparam";
LAB_00433276:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181c,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar3 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_00433276;
  }
  if (numparam == 3) {
    pcVar3 = "(paramnum) < numparam";
LAB_0043329e:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181d,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    pcVar3 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0043329e;
  }
  if ((uint)numparam < 5) {
    pcVar3 = "(paramnum) < numparam";
LAB_004332c6:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181e,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\x01') {
    pcVar3 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004332c6;
  }
  local_48.X = (double)param[2].field_0.field_1.a;
  local_48.Y = (double)param[3].field_0.field_1.a;
  local_48.Z = (double)param[4].field_0.field_1.a;
  if (numparam == 5) {
    param = defaultparam->Array;
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00433335:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x181f,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar1 = param[5].field_0.i != 0;
LAB_0043318a:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00433354:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1820,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    alert = param[6].field_0.i != 0;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00433335;
    }
    bVar1 = param[5].field_0.i != 0;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_0043318a;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00433354;
    }
    alert = param[6].field_0.i != 0;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_004332e5;
      }
      goto LAB_004331a9;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004332e5:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1821,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_004331a9:
  bVar1 = P_HitWater(thing,sec,&local_48,bVar1,alert,param[7].field_0.i != 0);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1822,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,(uint)bVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, HitWater)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER_NOT_NULL(sec, sector_t);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL_DEF(checkabove);
	PARAM_BOOL_DEF(alert);
	PARAM_BOOL_DEF(force);
	ACTION_RETURN_BOOL(P_HitWater(self, sec, DVector3(x, y, z), checkabove, alert, force));
}